

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O0

void __thiscall FMemArena::FreeAll(FMemArena *this)

{
  Block *pBVar1;
  Block *local_20;
  Block *block;
  Block *next;
  FMemArena *this_local;
  
  local_20 = this->TopBlock;
  while (local_20 != (Block *)0x0) {
    pBVar1 = local_20->NextBlock;
    Block::Reset(local_20);
    local_20->NextBlock = this->FreeBlocks;
    this->FreeBlocks = local_20;
    local_20 = pBVar1;
  }
  this->TopBlock = (Block *)0x0;
  return;
}

Assistant:

void FMemArena::FreeAll()
{
	for (Block *next, *block = TopBlock; block != NULL; block = next)
	{
		next = block->NextBlock;
		block->Reset();
		block->NextBlock = FreeBlocks;
		FreeBlocks = block;
	}
	TopBlock = NULL;
}